

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheet.cpp
# Opt level: O3

void __thiscall Rml::StyleSheet::MergeStyleSheet(StyleSheet *this,StyleSheet *other_sheet)

{
  NodePtr pDVar1;
  NodePtr pDVar2;
  ulong uVar3;
  ulong *puVar4;
  type this_00;
  ulong uVar5;
  type pNVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes>
  *other_keyframes;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  NodePtr pDVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  char *pcVar14;
  NodePtr pDVar15;
  SpritesheetList *this_01;
  ulong *puVar16;
  uint8_t *puVar17;
  SpritesheetList *this_02;
  const_iterator cVar18;
  const_iterator cVar19;
  
  StyleSheetNode::MergeHierarchy
            ((this->root)._M_t.
             super___uniq_ptr_impl<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>.
             _M_t.
             super__Tuple_impl<0UL,_Rml::StyleSheetNode_*,_std::default_delete<Rml::StyleSheetNode>_>
             .super__Head_base<0UL,_Rml::StyleSheetNode_*,_false>._M_head_impl,
             (other_sheet->root)._M_t.
             super___uniq_ptr_impl<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>.
             _M_t.
             super__Tuple_impl<0UL,_Rml::StyleSheetNode_*,_std::default_delete<Rml::StyleSheetNode>_>
             .super__Head_base<0UL,_Rml::StyleSheetNode_*,_false>._M_head_impl,
             this->specificity_offset);
  this->specificity_offset = this->specificity_offset + other_sheet->specificity_offset;
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&this->keyframes,(other_sheet->keyframes).mNumElements + (this->keyframes).mNumElements)
  ;
  cVar18 = robin_hood::detail::
           Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::cbegin(&other_sheet->keyframes);
  pDVar12 = cVar18.mKeyVals;
  pDVar1 = (NodePtr)(other_sheet->keyframes).mInfo;
  while (pDVar12 != pDVar1) {
    puVar17 = cVar18.mInfo;
    pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)cVar18.mKeyVals;
    this_00 = robin_hood::detail::
              Table<true,80ul,std::__cxx11::string,Rml::Keyframes,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              ::doCreateByKey<std::__cxx11::string_const&,Rml::Keyframes>
                        ((Table<true,80ul,std::__cxx11::string,Rml::Keyframes,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                          *)&this->keyframes,pbVar13);
    ::std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>::operator=
              (&this_00->property_ids,
               (vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_> *)(pbVar13 + 1));
    ::std::vector<Rml::KeyframeBlock,_std::allocator<Rml::KeyframeBlock>_>::operator=
              (&this_00->blocks,
               (vector<Rml::KeyframeBlock,_std::allocator<Rml::KeyframeBlock>_> *)
               ((long)&pbVar13[1].field_2 + 8));
    paVar11 = &pbVar13[2].field_2;
    uVar5 = *(ulong *)(puVar17 + 1);
    if (uVar5 == 0) {
      puVar4 = (ulong *)(puVar17 + 9);
      do {
        puVar16 = puVar4;
        paVar11 = paVar11 + 0x28;
        uVar5 = *puVar16;
        puVar4 = puVar16 + 1;
      } while (uVar5 == 0);
    }
    else {
      puVar16 = (ulong *)(puVar17 + 1);
    }
    uVar3 = 0;
    if (uVar5 != 0) {
      for (; (uVar5 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
      }
    }
    uVar5 = uVar3 >> 3 & 0x1fffffff;
    pDVar12 = (NodePtr)(paVar11->_M_local_buf + (uint)((int)uVar5 * 0x50));
    cVar18.mInfo = (uint8_t *)((long)puVar16 + uVar5);
    cVar18.mKeyVals = pDVar12;
  }
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&this->named_decorator_map,
            (other_sheet->named_decorator_map).mNumElements +
            (this->named_decorator_map).mNumElements);
  cVar19 = robin_hood::detail::
           Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::cbegin(&other_sheet->named_decorator_map);
  pDVar15 = cVar19.mKeyVals;
  pDVar2 = (NodePtr)(other_sheet->named_decorator_map).mInfo;
  while (pDVar15 != pDVar2) {
    puVar17 = cVar19.mInfo;
    pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)cVar19.mKeyVals;
    pNVar6 = robin_hood::detail::
             Table<true,80ul,std::__cxx11::string,Rml::NamedDecorator,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
             ::doCreateByKey<std::__cxx11::string_const&,Rml::NamedDecorator>
                       ((Table<true,80ul,std::__cxx11::string,Rml::NamedDecorator,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                         *)&this->named_decorator_map,pbVar13);
    ::std::__cxx11::string::_M_assign((string *)pNVar6);
    pNVar6->instancer = (DecoratorInstancer *)pbVar13[2]._M_dataplus._M_p;
    robin_hood::detail::
    Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
    ::operator=(&(pNVar6->properties).properties,
                (Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                 *)&pbVar13[2]._M_string_length);
    pcVar14 = pbVar13[3].field_2._M_local_buf + 8;
    uVar5 = *(ulong *)(puVar17 + 1);
    if (uVar5 == 0) {
      puVar4 = (ulong *)(puVar17 + 9);
      do {
        puVar16 = puVar4;
        pcVar14 = pcVar14 + 0x3c0;
        uVar5 = *puVar16;
        puVar4 = puVar16 + 1;
      } while (uVar5 == 0);
    }
    else {
      puVar16 = (ulong *)(puVar17 + 1);
    }
    uVar3 = 0;
    if (uVar5 != 0) {
      for (; (uVar5 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
      }
    }
    uVar5 = uVar3 >> 3 & 0x1fffffff;
    pDVar15 = (NodePtr)(pcVar14 + uVar5 * 0x78);
    cVar19.mInfo = (uint8_t *)((long)puVar16 + uVar5);
    cVar19.mKeyVals = pDVar15;
  }
  this_01 = &this->spritesheet_list;
  sVar7 = SpritesheetList::NumSpriteSheets(this_01);
  this_02 = &other_sheet->spritesheet_list;
  sVar8 = SpritesheetList::NumSpriteSheets(this_02);
  sVar9 = SpritesheetList::NumSprites(this_01);
  sVar10 = SpritesheetList::NumSprites(this_02);
  SpritesheetList::Reserve(this_01,sVar7 + sVar8,sVar9 + sVar10);
  SpritesheetList::Merge(this_01,this_02);
  return;
}

Assistant:

void StyleSheet::MergeStyleSheet(const StyleSheet& other_sheet)
{
	RMLUI_ZoneScoped;

	root->MergeHierarchy(other_sheet.root.get(), specificity_offset);
	specificity_offset += other_sheet.specificity_offset;

	// Any matching @keyframe names are overridden as per CSS rules
	keyframes.reserve(keyframes.size() + other_sheet.keyframes.size());
	for (auto& other_keyframes : other_sheet.keyframes)
	{
		keyframes[other_keyframes.first] = other_keyframes.second;
	}

	// Copy over the decorators, and replace any matching decorator names from other_sheet
	named_decorator_map.reserve(named_decorator_map.size() + other_sheet.named_decorator_map.size());
	for (auto& other_decorator : other_sheet.named_decorator_map)
	{
		named_decorator_map[other_decorator.first] = other_decorator.second;
	}

	spritesheet_list.Reserve(spritesheet_list.NumSpriteSheets() + other_sheet.spritesheet_list.NumSpriteSheets(),
		spritesheet_list.NumSprites() + other_sheet.spritesheet_list.NumSprites());
	spritesheet_list.Merge(other_sheet.spritesheet_list);
}